

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O3

void __thiscall Polymer::Polymer(Polymer *this,string *name,int start,int stop)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  pointer pdVar3;
  pointer ppVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  interaction_map;
  undefined1 local_118 [16];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_108;
  _Alloc_hider _Stack_100;
  _Base_ptr local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  pointer local_e0;
  uint *puStack_d8;
  undefined4 local_d0;
  undefined4 uStack_cc;
  uint local_c8 [4];
  pointer local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_b0;
  bool local_a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  local_98;
  undefined1 local_68 [8];
  _Rb_tree_node_base _Stack_60;
  size_t local_40;
  
  (this->super_enable_shared_from_this<Polymer>)._M_weak_this.
  super___weak_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<Polymer>)._M_weak_this.
  super___weak_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_vptr_Polymer = (_func_int **)&PTR_Initialize_001a5860;
  p_Var1 = &(this->termination_signal_).slots_._M_t._M_impl.super__Rb_tree_header;
  (this->termination_signal_).slots_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->termination_signal_).slots_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->termination_signal_).slots_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->termination_signal_).slots_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->termination_signal_).slots_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->termination_signal_).current_id_ = 0;
  (this->wrapper_).super___weak_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->wrapper_).super___weak_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  pcVar2 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name_,pcVar2,pcVar2 + name->_M_string_length);
  this->start_ = start;
  this->stop_ = stop;
  (this->polymerases_).prop_sum_ = 0.0;
  (this->polymerases_).pol_count_ = 0;
  (this->polymerases_).prop_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->polymerases_).prop_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->polymerases_).prop_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->polymerases_).polymerases_.
  super__Vector_base<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->polymerases_).polymerases_.
  super__Vector_base<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->polymerases_).polymerases_.
  super__Vector_base<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->polymerases_).seq_._M_dataplus._M_p = (pointer)&(this->polymerases_).seq_.field_2;
  (this->polymerases_).seq_._M_string_length = 0;
  (this->polymerases_).seq_.field_2._M_local_buf[0] = '\0';
  (this->polymerases_).weights_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->polymerases_).weights_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->polymerases_).weights_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->degrade_ = false;
  this->attached_ = false;
  memset(&this->binding_intervals_,0,0x90);
  _Stack_100._M_p = local_118 + 8;
  local_108._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_118._0_8_ = (_func_int **)0x0;
  local_118._8_8_ = (element_type *)0x0;
  local_f0._M_allocated_capacity = 0;
  local_f8 = (_Base_ptr)_Stack_100._M_p;
  Mask::Mask(&this->mask_,0,0,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
              *)local_118);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
               *)local_118);
  p_Var1 = &(this->uncovered_)._M_t._M_impl.super__Rb_tree_header;
  (this->uncovered_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->uncovered_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->uncovered_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->uncovered_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->uncovered_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_118._0_8_ = (_func_int **)0x0;
  local_118._8_8_ = local_118._8_8_ & 0xffffffff00000000;
  local_f0._M_allocated_capacity._0_4_ = 0;
  local_f0._M_allocated_capacity._4_4_ = 0;
  local_f0._8_4_ = 0;
  local_f0._12_4_ = 0;
  local_f0._M_allocated_capacity = 0;
  local_f0._8_8_ = 0;
  local_e0 = (pointer)0x0;
  local_d0 = 0;
  uStack_cc = 0;
  local_c8[0] = local_c8[0] & 0xffffff00;
  local_b8 = (pointer)0x0;
  aStack_b0._M_allocated_capacity = 0;
  aStack_b0._8_8_ = (pointer)0x0;
  (this->polymerases_).pol_count_ = 0;
  (this->polymerases_).prop_sum_ = 0.0;
  pdVar3 = (this->polymerases_).prop_list_.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->polymerases_).prop_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->polymerases_).prop_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->polymerases_).prop_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8 = (_Base_ptr)0x0;
  local_108._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  _Stack_100._M_p = (pointer)0x0;
  ppVar4 = (pointer)0x0;
  puStack_d8 = local_c8;
  if (pdVar3 != (pointer)0x0) {
    operator_delete(pdVar3);
    ppVar4 = local_e0;
  }
  _Stack_60._M_parent =
       (_Base_ptr)
       (this->polymerases_).polymerases_.
       super__Vector_base<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->polymerases_).polymerases_.
  super__Vector_base<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar4;
  local_68 = (undefined1  [8])
             (this->polymerases_).polymerases_.
             super__Vector_base<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  _Stack_60._0_8_ =
       (this->polymerases_).polymerases_.
       super__Vector_base<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  *(undefined4 *)
   &(this->polymerases_).polymerases_.
    super__Vector_base<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = local_f0._M_allocated_capacity._0_4_;
  *(undefined4 *)
   ((long)&(this->polymerases_).polymerases_.
           super__Vector_base<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = local_f0._M_allocated_capacity._4_4_;
  *(undefined4 *)
   &(this->polymerases_).polymerases_.
    super__Vector_base<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = local_f0._8_4_;
  *(undefined4 *)
   ((long)&(this->polymerases_).polymerases_.
           super__Vector_base<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = local_f0._12_4_;
  local_f0._M_allocated_capacity = 0;
  local_f0._8_8_ = 0;
  local_e0 = (pointer)0x0;
  std::
  vector<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
  ::~vector((vector<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
             *)local_68);
  std::__cxx11::string::operator=((string *)&(this->polymerases_).seq_,(string *)&puStack_d8);
  pdVar3 = (this->polymerases_).weights_.super__Vector_base<double,_std::allocator<double>_>._M_impl
           .super__Vector_impl_data._M_start;
  (this->polymerases_).weights_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = local_b8;
  (this->polymerases_).weights_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)aStack_b0._M_allocated_capacity;
  (this->polymerases_).weights_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)aStack_b0._8_8_;
  aStack_b0._8_8_ = 0;
  local_b8 = (pointer)0x0;
  aStack_b0._M_allocated_capacity = 0;
  if (pdVar3 != (pointer)0x0) {
    operator_delete(pdVar3);
    if (local_b8 != (pointer)0x0) {
      operator_delete(local_b8);
    }
  }
  if (puStack_d8 != local_c8) {
    operator_delete(puStack_d8);
  }
  std::
  vector<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
  ::~vector((vector<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
             *)&local_f0);
  if ((_Base_ptr)local_108._M_pi != (_Base_ptr)0x0) {
    operator_delete(local_108._M_pi);
  }
  _Stack_60._M_left = &_Stack_60;
  _Stack_60._0_8_ = _Stack_60._0_8_ & 0xffffffff00000000;
  _Stack_60._M_parent = (_Base_ptr)0x0;
  local_40 = 0;
  _Stack_60._M_right = _Stack_60._M_left;
  Mask::Mask((Mask *)local_118,this->stop_ + 1,this->stop_,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
              *)local_68);
  std::__cxx11::string::_M_assign((string *)&(this->mask_).super_MobileElement.name_);
  *(ulong *)&(this->mask_).super_MobileElement.field_0x44 = CONCAT44(local_d0,puStack_d8._4_4_);
  *(ulong *)((long)&(this->mask_).super_MobileElement.speed_ + 4) = CONCAT44(local_c8[0],uStack_cc);
  *(pointer *)&(this->mask_).super_MobileElement.start_ = local_e0;
  *(uint **)&(this->mask_).super_MobileElement.footprint_ = puStack_d8;
  std::__cxx11::string::_M_assign((string *)&(this->mask_).super_MobileElement.gene_bound_);
  (this->mask_).super_MobileElement.polymerasereadthrough_ = local_a0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::operator=(&(this->mask_).interactions_._M_t,&local_98);
  local_118._0_8_ = &PTR__Mask_001a5650;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~_Rb_tree(&local_98);
  MobileElement::~MobileElement((MobileElement *)local_118);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
               *)local_68);
  return;
}

Assistant:

Polymer::Polymer(const std::string &name, int start, int stop)
    : name_(name),
      start_(start),
      stop_(stop) {
  polymerases_ = MobileElementManager();
  std::map<std::string, double> interaction_map;
  mask_ = Mask(stop_ + 1, stop_, interaction_map);
}